

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpOperations.cpp
# Opt level: O1

pointer __thiscall
gmlc::networking::establishConnection
          (networking *this,SocketFactory *sf,io_context *io_context,string *host,string *port,
          milliseconds timeOut)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  pointer pcVar8;
  TcpConnection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  pointer pVar10;
  int local_7c;
  element_type *local_78;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  __atomic_base<unsigned_long> local_68;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string *local_50;
  string *local_48;
  milliseconds local_40;
  pointer local_38;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_60 = (element_type *)sf;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)io_context;
  local_50 = host;
  local_48 = port;
  pVar10 = TcpConnection::create
                     ((TcpConnection *)&stack0xffffffffffffff88,sf,io_context,host,port,0x27d0);
  _Var7._M_pi = _Stack_70._M_pi;
  peVar1 = local_78;
  _Var6 = pVar10.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_78 = (TcpConnection *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  *(element_type **)this = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var7._M_pi;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    _Var6._M_pi = extraout_RDX;
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (0 < timeOut.__r) {
    local_38 = (pointer)std::chrono::_V2::steady_clock::now();
    this_00 = *(TcpConnection **)this;
    local_7c = 1;
    p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    local_68._M_i = timeOut.__r;
    local_40.__r = timeOut.__r;
    do {
      pcVar8 = (pointer)local_40.__r;
      bVar2 = TcpConnection::waitUntilConnected(this_00,timeOut);
      _Var6._M_pi = extraout_RDX_01;
      _Var7._M_pi = p_Var9;
      if (bVar2) break;
      lVar4 = std::chrono::_V2::steady_clock::now();
      _Var6._M_pi = SUB168(SEXT816(lVar4 - (long)local_38) * SEXT816(-0x431bde82d7b634db),8);
      pcVar8 = pcVar8 + (((long)_Var6._M_pi >> 0x12) - ((long)_Var6._M_pi >> 0x3f));
      bVar2 = local_7c < 2;
      if (bVar2 || -1 < (long)pcVar8) {
        if ((long)(local_68._M_i - (long)pcVar8) < 100) {
          local_78 = (TcpConnection *)0x0;
          _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbebc200;
          do {
            iVar3 = nanosleep((timespec *)&stack0xffffffffffffff88,
                              (timespec *)&stack0xffffffffffffff88);
            if (iVar3 != -1) break;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
        }
        timeOut.__r = (rep)(pointer)0x190;
        if (-1 < (long)pcVar8) {
          timeOut.__r = (rep)pcVar8;
        }
        pVar10 = TcpConnection::create
                           ((TcpConnection *)&stack0xffffffffffffff88,(SocketFactory *)local_60,
                            (io_context *)local_58._M_pi,local_50,local_48,0x27d0);
        _Var7._M_pi = _Stack_70._M_pi;
        this_00 = local_78;
        _Var6 = pVar10.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        local_78 = (TcpConnection *)0x0;
        _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          _Var6._M_pi = extraout_RDX_02;
        }
        if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
          _Var6._M_pi = extraout_RDX_03;
        }
        local_7c = local_7c + 1;
        local_68._M_i = (__int_type_conflict3)pcVar8;
      }
      else {
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          _Var6._M_pi = extraout_RDX_04;
        }
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (TcpConnection *)0x0;
        timeOut.__r = (rep)pcVar8;
      }
      p_Var9 = _Var7._M_pi;
    } while (bVar2 || -1 < (long)pcVar8);
    *(TcpConnection **)this = this_00;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var7._M_pi;
  }
  pVar10.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var6._M_pi;
  pVar10.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (pointer)pVar10.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer establishConnection(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& host,
    const std::string& port,
    std::chrono::milliseconds timeOut)
{
    using std::chrono::milliseconds;
    using std::chrono::steady_clock;

    using namespace std::chrono_literals;  // NOLINT

    TcpConnection::pointer connectionPtr;
    connectionPtr = TcpConnection::create(sf, io_context, host, port);
    if (timeOut <= std::chrono::milliseconds(0)) {
        return connectionPtr;
    }

    auto tick = steady_clock::now();
    milliseconds timeRemaining(timeOut);
    milliseconds timeRemPrev(timeOut);
    int trycnt = 1;
    while (!connectionPtr->waitUntilConnected(timeRemaining)) {
        auto tock = steady_clock::now();
        timeRemaining = milliseconds(timeOut) -
            std::chrono::duration_cast<milliseconds>(tock - tick);
        if ((timeRemaining < 0ms) && (trycnt > 1)) {
            connectionPtr = nullptr;
            break;
        }
        // make sure we slow down and sleep for a little bit
        if (timeRemPrev - timeRemaining < 100ms) {
            std::this_thread::sleep_for(200ms);
        }
        timeRemPrev = timeRemaining;
        if (timeRemaining < 0ms) {
            timeRemaining = 400ms;
        }

        // lets try to connect again
        ++trycnt;
        connectionPtr = TcpConnection::create(sf, io_context, host, port);
    }
    return connectionPtr;
}